

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O0

void pstore::serialize::serializer<pstore::indirect_string,void>::
     read_string_address<pstore::serialize::archive::database_reader&>
               (database_reader *archive,value_type *value)

{
  database *this;
  typed_address<pstore::address> addr;
  address a;
  type paVar1;
  address local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  database *db;
  value_type *value_local;
  database_reader *archive_local;
  
  db = (database *)value;
  value_local = (value_type *)archive;
  addr.a_.a_ = (address)serialize::archive::database_reader::get_db(archive);
  this = db;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr.a_.a_;
  a = serialize::archive::database_reader::get_address((database_reader *)value_local);
  typed_address<pstore::address>::make(a);
  database::getrou<pstore::address,void>((database *)&stack0xffffffffffffffc8,addr);
  paVar1 = std::unique_ptr<const_pstore::address,_void_(*)(const_pstore::address_*)>::operator*
                     ((unique_ptr<const_pstore::address,_void_(*)(const_pstore::address_*)> *)
                      &stack0xffffffffffffffc8);
  local_28.a_ = paVar1->a_;
  indirect_string::indirect_string((indirect_string *)this,(database *)addr.a_.a_,local_28);
  std::unique_ptr<const_pstore::address,_void_(*)(const_pstore::address_*)>::~unique_ptr
            ((unique_ptr<const_pstore::address,_void_(*)(const_pstore::address_*)> *)
             &stack0xffffffffffffffc8);
  return;
}

Assistant:

void serializer<indirect_string>::read_string_address (DBArchive && archive,
                                                               value_type & value) {
            database const & db = archive.get_db ();
            new (&value)
                value_type (db, *db.getrou (typed_address<address>::make (archive.get_address ())));
        }